

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O1

FORM * new_form(FIELD **fields)

{
  short sVar1;
  short sVar2;
  undefined2 uVar3;
  int iVar4;
  FORM *form;
  int *piVar5;
  long lVar6;
  FORM *pFVar7;
  FORM *pFVar8;
  byte bVar9;
  
  bVar9 = 0;
  form = (FORM *)malloc(0x80);
  if (form == (FORM *)0x0) {
    iVar4 = -1;
  }
  else {
    pFVar7 = _nc_Default_Form;
    pFVar8 = form;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      sVar1 = pFVar7->rows;
      sVar2 = pFVar7->cols;
      uVar3 = *(undefined2 *)&pFVar7->field_0x6;
      pFVar8->status = pFVar7->status;
      pFVar8->rows = sVar1;
      pFVar8->cols = sVar2;
      *(undefined2 *)&pFVar8->field_0x6 = uVar3;
      pFVar7 = (FORM *)((long)pFVar7 + (ulong)bVar9 * -0x10 + 8);
      pFVar8 = (FORM *)((long)pFVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    iVar4 = Associate_Fields(form,fields);
    if (iVar4 == 0) {
      iVar4 = 0;
      goto LAB_003a2901;
    }
    free_form(form);
  }
  form = (FORM *)0x0;
LAB_003a2901:
  if (form == (FORM *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = iVar4;
  }
  return form;
}

Assistant:

FORM *new_form(FIELD ** fields)
{	
  int err = E_SYSTEM_ERROR;

  FORM *form = (FORM *)malloc(sizeof(FORM));
  
  if (form)
    {
      *form = *_nc_Default_Form;
      if ((err=Associate_Fields(form,fields))!=E_OK)
	{
	  free_form(form);
	  form = (FORM *)0;
	}
    }

  if (!form)
    SET_ERROR(err);
  
  return(form);
}